

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O0

ares_status_t ares_sortaddrinfo(ares_channel_t *channel,ares_addrinfo_node *list_sentinel)

{
  int iVar1;
  undefined8 *__base;
  addrinfo_sort_elem *elems;
  ulong uStack_38;
  int has_src_addr;
  size_t i;
  size_t nelem;
  ares_addrinfo_node *cur;
  ares_addrinfo_node *list_sentinel_local;
  ares_channel_t *channel_local;
  
  i = 0;
  for (nelem = (size_t)list_sentinel->ai_next; nelem != 0; nelem = *(size_t *)(nelem + 0x20)) {
    i = i + 1;
  }
  if (i == 0) {
    channel_local._4_4_ = ARES_ENODATA;
  }
  else {
    __base = (undefined8 *)ares_malloc(i * 0x30);
    if (__base == (undefined8 *)0x0) {
      channel_local._4_4_ = ARES_ENOMEM;
    }
    else {
      uStack_38 = 0;
      nelem = (size_t)list_sentinel->ai_next;
      for (; uStack_38 < i; uStack_38 = uStack_38 + 1) {
        if (nelem == 0) {
          __assert_fail("cur != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/c-ares[P]c-ares/src/lib/ares_sortaddrinfo.c"
                        ,0x1a7,
                        "ares_status_t ares_sortaddrinfo(ares_channel_t *, struct ares_addrinfo_node *)"
                       );
        }
        __base[uStack_38 * 6] = nelem;
        __base[uStack_38 * 6 + 5] = uStack_38;
        iVar1 = find_src_addr(channel,*(sockaddr **)(nelem + 0x18),
                              (sockaddr *)((long)__base + uStack_38 * 0x30 + 0xc));
        if (iVar1 == -1) {
          ares_free(__base);
          return ARES_ENOTFOUND;
        }
        *(uint *)(__base + uStack_38 * 6 + 1) = (uint)(iVar1 == 1);
        nelem = *(size_t *)(nelem + 0x20);
      }
      qsort(__base,i,0x30,rfc6724_compare);
      list_sentinel->ai_next = (ares_addrinfo_node *)*__base;
      for (uStack_38 = 0; uStack_38 < i - 1; uStack_38 = uStack_38 + 1) {
        *(undefined8 *)(__base[uStack_38 * 6] + 0x20) = __base[(uStack_38 + 1) * 6];
      }
      *(undefined8 *)(__base[(i - 1) * 6] + 0x20) = 0;
      ares_free(__base);
      channel_local._4_4_ = ARES_SUCCESS;
    }
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_sortaddrinfo(ares_channel_t            *channel,
                                struct ares_addrinfo_node *list_sentinel)
{
  struct ares_addrinfo_node *cur;
  size_t                     nelem = 0;
  size_t                     i;
  int                        has_src_addr;
  struct addrinfo_sort_elem *elems;

  cur = list_sentinel->ai_next;
  while (cur) {
    ++nelem;
    cur = cur->ai_next;
  }

  if (!nelem) {
    return ARES_ENODATA;
  }

  elems = (struct addrinfo_sort_elem *)ares_malloc(
    nelem * sizeof(struct addrinfo_sort_elem));
  if (!elems) {
    return ARES_ENOMEM;
  }

  /*
   * Convert the linked list to an array that also contains the candidate
   * source address for each destination address.
   */
  for (i = 0, cur = list_sentinel->ai_next; i < nelem;
       ++i, cur   = cur->ai_next) {
    assert(cur != NULL);
    elems[i].ai             = cur;
    elems[i].original_order = i;
    has_src_addr = find_src_addr(channel, cur->ai_addr, &elems[i].src_addr.sa);
    if (has_src_addr == -1) {
      ares_free(elems);
      return ARES_ENOTFOUND;
    }
    elems[i].has_src_addr = (has_src_addr == 1) ? ARES_TRUE : ARES_FALSE;
  }

  /* Sort the addresses, and rearrange the linked list so it matches the sorted
   * order. */
  qsort((void *)elems, nelem, sizeof(struct addrinfo_sort_elem),
        rfc6724_compare);

  list_sentinel->ai_next = elems[0].ai;
  for (i = 0; i < nelem - 1; ++i) {
    elems[i].ai->ai_next = elems[i + 1].ai;
  }
  elems[nelem - 1].ai->ai_next = NULL;

  ares_free(elems);
  return ARES_SUCCESS;
}